

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable_String.h
# Opt level: O0

string * vstring_printf_abi_cxx11_(string *__return_storage_ptr__,char *format,__va_list_tag *args)

{
  int iVar1;
  char *__s;
  size_type sVar2;
  undefined8 uStack_48;
  int min_length;
  va_list args_copy;
  __va_list_tag *args_local;
  char *format_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  args_copy[0].overflow_arg_area = args->reg_save_area;
  uStack_48._0_4_ = args->gp_offset;
  uStack_48._4_4_ = args->fp_offset;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  iVar1 = vsnprintf((char *)0x0,0,format,&uStack_48);
  if (0 < iVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,(long)iVar1);
    __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                    (__return_storage_ptr__);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (__return_storage_ptr__);
    iVar1 = vsnprintf(__s,sVar2 + 1,format,args);
    if (iVar1 < 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                (__return_storage_ptr__);
    }
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (__return_storage_ptr__);
    if (sVar2 != (long)iVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (__return_storage_ptr__,(long)iVar1,0xffffffffffffffff);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string vstring_printf(const char* format, va_list args) {
	std::string result;

	// Calculate size needed for formatted string
	va_list args_copy;
	va_copy(args_copy, args);
	int min_length = std::vsnprintf(nullptr, 0, format, args_copy);
	va_end(args_copy);

	if (min_length > 0) {
		result.resize(min_length);
		min_length = vsnprintf(result.data(), result.size() + 1, format, args);
		if (min_length <= 0) {
			result.clear();
		}

		if (result.size() != min_length) {
			// This should never happen; if it does, it's probably indicative of a race condition
			result.erase(min_length);
		}
	}

	return result;
}